

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

subiter_type * __thiscall
gnuplotio::
VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
::deref_subiter(subiter_type *__return_storage_ptr__,
               VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>
               *this)

{
  pointer pIVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  subiter_type sVar4;
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  subvec;
  allocator_type local_39;
  _Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  local_38;
  
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  ::vector((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
            *)&local_38,
           (long)(this->rvec).
                 super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->rvec).
                 super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,&local_39);
  lVar3 = 0;
  for (uVar2 = 0;
      pIVar1 = (this->rvec).
               super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->rvec).
                            super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4);
      uVar2 = uVar2 + 1) {
    sVar4 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
            ::deref_subiter((IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_*,_std::vector<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::allocator<std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>_>_>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)((long)&(pIVar1->it)._M_current + lVar3));
    *(pair<double,_int> **)
     ((long)&((local_38._M_impl.super__Vector_impl_data._M_start)->it)._M_current + lVar3) =
         sVar4.it._M_current._M_current;
    *(pair<double,_int> **)
     ((long)&((local_38._M_impl.super__Vector_impl_data._M_start)->end)._M_current + lVar3) =
         sVar4.end._M_current._M_current;
    lVar3 = lVar3 + 0x10;
  }
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  ::vector(&__return_storage_ptr__->rvec,
           (vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
            *)&local_38);
  std::
  _Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>_>_>
  ::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

subiter_type deref_subiter() const {
        std::vector<typename RT::subiter_type> subvec(rvec.size());
        for(size_t i=0; i<rvec.size(); i++) {
            subvec[i] = rvec[i].deref_subiter();
        }
        return subiter_type(subvec);
    }